

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_writepage(LispPTR *args)

{
  int iVar1;
  DLword *page;
  LispPTR *pLVar2;
  int *piVar3;
  __off_t _Var4;
  ssize_t sVar5;
  bool bVar6;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  off_t offval;
  ssize_t rval;
  int count;
  char *bufp;
  int npage;
  int fd;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  if ((*args & 0xfff0000) == 0xe0000) {
    local_44 = *args & 0xffff;
  }
  else {
    if ((*args & 0xfff0000) == 0xf0000) {
      local_48 = *args | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(*args);
      local_48 = *pLVar2;
    }
    local_44 = local_48;
  }
  if ((args[1] & 0xfff0000) == 0xe0000) {
    local_4c = args[1] & 0xffff;
  }
  else {
    if ((args[1] & 0xfff0000) == 0xf0000) {
      local_50 = args[1] | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(args[1]);
      local_50 = *pLVar2;
    }
    local_4c = local_50;
  }
  page = NativeAligned2FromLAddr(args[2]);
  if ((args[3] & 0xfff0000) == 0xe0000) {
    local_54 = args[3] & 0xffff;
  }
  else {
    if ((args[3] & 0xfff0000) == 0xf0000) {
      local_58 = args[3] | 0xffff0000;
    }
    else {
      pLVar2 = NativeAligned4FromLAddr(args[3]);
      local_58 = *pLVar2;
    }
    local_54 = local_58;
  }
  while( true ) {
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      _Var4 = lseek(local_44,(long)(int)(local_4c << 9),0);
      bVar6 = false;
      if (_Var4 == -1) {
        piVar3 = __errno_location();
        bVar6 = *piVar3 == 4;
      }
    } while (bVar6);
    alarm(0);
    if (_Var4 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      piVar3 = __errno_location();
      *Lisp_errno = *piVar3;
      return 0;
    }
  }
  word_swap_page(page,(int)(local_54 + 3) >> 2);
  while( true ) {
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sVar5 = write(local_44,page,(long)(int)local_54);
      bVar6 = false;
      if (sVar5 == -1) {
        piVar3 = __errno_location();
        bVar6 = *piVar3 == 4;
      }
    } while (bVar6);
    alarm(0);
    if (sVar5 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      piVar3 = __errno_location();
      *Lisp_errno = *piVar3;
      word_swap_page(page,(int)(local_54 + 3) >> 2);
      return 0;
    }
  }
  word_swap_page(page,(int)(local_54 + 3) >> 2);
  return 0x4c;
}

Assistant:

LispPTR COM_writepage(LispPTR *args)
{
  int fd;
  int npage;
  char *bufp;
  int count;
  ssize_t rval;
  off_t offval;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);
  count = LispNumToCInt(args[3]);

sklp2:
  TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
  if (offval == -1) {
    if (errno == EINTR) goto sklp2; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

/* OK to write the page. */

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

wlp:
  TIMEOUT(rval = write(fd, bufp, count));
  if (rval == -1) {
    if (errno == EINTR) goto wlp; /* interrupted; retry */
    *Lisp_errno = errno;
#ifdef BYTESWAP
    word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */
    return (NIL);
  }

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, (count + 3) >> 2);
#endif /* BYTESWAP */

  return (ATOM_T);
}